

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O1

bool __thiscall
cmSetCommand::InitialPass
          (cmSetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  char *__s1;
  cmMakefile *pcVar4;
  bool bVar5;
  int iVar6;
  CacheEntryType CVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  undefined8 uVar11;
  cmState *this_00;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  string value;
  string currValue;
  allocator local_a5;
  undefined4 local_a4;
  string local_a0;
  string local_80;
  CacheEntryType local_60;
  allocator local_59;
  string local_58;
  pointer local_38;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  __s1 = (pbVar2->_M_dataplus)._M_p;
  iVar6 = strncmp(__s1,"ENV{",4);
  if ((iVar6 != 0) || (sVar8 = strlen(__s1), sVar8 < 6)) {
    lVar16 = (long)pbVar3 - (long)pbVar2;
    lVar10 = lVar16 >> 5;
    if (lVar10 == 2) {
      iVar6 = std::__cxx11::string::compare((char *)((long)pbVar2 + lVar16 + -0x20));
      if (iVar6 != 0) goto LAB_0040eb1b;
      pcVar4 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_a0,__s1,(allocator *)&local_80);
      cmMakefile::RaiseScope(pcVar4,&local_a0,(char *)0x0);
    }
    else {
      if (lVar10 != 1) {
LAB_0040eb1b:
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar13 = (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
        if ((uVar13 < 0x21) ||
           (iVar6 = std::__cxx11::string::compare((char *)((long)pbVar2 + (uVar13 - 0x20))),
           iVar6 != 0)) {
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
          bVar5 = false;
          uVar15 = 0;
          if (0x80 < uVar13) {
            iVar6 = std::__cxx11::string::compare((char *)((long)pbVar2 + (uVar13 - 0x20)));
            bVar5 = iVar6 == 0;
            uVar15 = (uint)bVar5;
          }
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
          if (uVar13 < 4) {
            local_a4 = 0;
            bVar17 = false;
          }
          else {
            uVar11 = std::__cxx11::string::compare((char *)(pbVar2 + (uVar13 - bVar5) + -3));
            bVar17 = (int)uVar11 == 0;
            local_a4 = (undefined4)CONCAT71((int7)((ulong)uVar11 >> 8),bVar17);
            uVar12 = uVar15 + 3;
            if (!bVar17) {
              uVar12 = uVar15;
            }
            bVar17 = false;
            uVar15 = uVar12;
          }
        }
        else {
          uVar15 = 1;
          bVar17 = true;
          local_a4 = 0;
          bVar5 = false;
        }
        local_58._M_dataplus._M_p =
             (pointer)((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
        local_58._M_string_length =
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (ulong)(uVar15 << 5);
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  (&local_80,
                   (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&local_58,";");
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
        paVar1 = &local_80.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                   local_80.field_2._M_local_buf[0]) + 1);
        }
        if (bVar17) {
          pcVar4 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string((string *)&local_80,__s1,(allocator *)&local_58);
          cmMakefile::RaiseScope(pcVar4,&local_80,local_a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,
                            CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                     local_80.field_2._M_local_buf[0]) + 1);
          }
          bVar14 = true;
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + -1));
          if (iVar6 != 0) {
            pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar13 = (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
            if (((uVar13 < 0x21) ||
                (iVar6 = std::__cxx11::string::compare((char *)((long)pbVar2 + (uVar13 - 0x40))),
                iVar6 != 0)) && (bVar5 != true || (byte)local_a4 != '\0')) {
              if ((byte)local_a4 == '\0') {
                local_60 = STRING;
                local_38 = (pointer)0x0;
              }
              else {
                pbVar2 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                lVar10 = ((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) -
                         (ulong)bVar5;
                local_60 = cmState::StringToCacheEntryType(pbVar2[lVar10 + -2]._M_dataplus._M_p);
                local_38 = (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[lVar10 + -1]._M_dataplus._M_p;
              }
              this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
              std::__cxx11::string::string((string *)&local_80,__s1,(allocator *)&local_58);
              pcVar9 = cmState::GetCacheEntryValue(this_00,&local_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != paVar1) {
                operator_delete(local_80._M_dataplus._M_p,
                                CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                         local_80.field_2._M_local_buf[0]) + 1);
              }
              if (pcVar9 == (char *)0x0) {
                bVar17 = false;
              }
              else {
                std::__cxx11::string::string((string *)&local_80,__s1,&local_59);
                CVar7 = cmState::GetCacheEntryType(this_00,&local_80);
                bVar17 = CVar7 != UNINITIALIZED;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != paVar1) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                           local_80.field_2._M_local_buf[0]) + 1);
                }
              }
              bVar14 = true;
              if ((bVar5 != false) || ((bVar17 & (byte)local_a4 & local_60 != INTERNAL) == 0)) {
                pcVar4 = (this->super_cmCommand).Makefile;
                if ((byte)local_a4 == 0) {
                  std::__cxx11::string::string((string *)&local_58,__s1,&local_a5);
                  cmMakefile::AddDefinition(pcVar4,&local_58,local_a0._M_dataplus._M_p);
                }
                else {
                  std::__cxx11::string::string((string *)&local_58,__s1,&local_a5);
                  cmMakefile::AddCacheDefinition
                            (pcVar4,&local_58,local_a0._M_dataplus._M_p,local_38,local_60,bVar5);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
              }
              goto LAB_0040edfe;
            }
          }
          local_80._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,"given invalid arguments for CACHE mode.","");
          cmCommand::SetError(&this->super_cmCommand,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,
                            CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                     local_80.field_2._M_local_buf[0]) + 1);
          }
          bVar14 = false;
        }
LAB_0040edfe:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
          return bVar14;
        }
        return bVar14;
      }
      pcVar4 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_a0,__s1,(allocator *)&local_80);
      cmMakefile::RemoveDefinition(pcVar4,&local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
      return true;
    }
    goto LAB_0040ec5a;
  }
  pcVar9 = (char *)operator_new__(sVar8);
  sVar8 = strlen(__s1);
  strncpy(pcVar9,__s1 + 4,sVar8 - 5);
  sVar8 = strlen(__s1);
  pcVar9[sVar8 - 5] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  sVar8 = strlen(pcVar9);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,pcVar9,pcVar9 + sVar8);
  std::__cxx11::string::append((char *)&local_a0);
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  bVar5 = cmsys::SystemTools::GetEnv(pcVar9,&local_80);
  operator_delete__(pcVar9);
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) ||
     (pbVar2[1]._M_string_length == 0)) {
    if (bVar5) goto LAB_0040ebfa;
  }
  else if (((!bVar5) || (local_80._M_string_length != pbVar2[1]._M_string_length)) ||
          ((local_80._M_string_length != 0 &&
           (iVar6 = bcmp(local_80._M_dataplus._M_p,pbVar2[1]._M_dataplus._M_p,
                         local_80._M_string_length), iVar6 != 0)))) {
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)pbVar2[1]._M_dataplus._M_p);
LAB_0040ebfa:
    cmsys::SystemTools::PutEnv(&local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
    return true;
  }
LAB_0040ec5a:
  operator_delete(local_a0._M_dataplus._M_p,
                  CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                           local_a0.field_2._M_local_buf[0]) + 1);
  return true;
}

Assistant:

bool cmSetCommand::InitialPass(std::vector<std::string> const& args,
                               cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // watch for ENV signatures
  const char* variable = args[0].c_str(); // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5) {
    // what is the variable name
    char* varName = new char[strlen(variable)];
    strncpy(varName, variable + 4, strlen(variable) - 5);
    varName[strlen(variable) - 5] = '\0';
    std::string putEnvArg = varName;
    putEnvArg += "=";

    // what is the current value if any
    std::string currValue;
    const bool currValueSet = cmSystemTools::GetEnv(varName, currValue);
    delete[] varName;

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty()) {
      // but only if it is different from current value
      if (!currValueSet || currValue != args[1]) {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
      }
      return true;
    }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValueSet) {
      cmSystemTools::PutEnv(putEnvArg);
    }
    return true;
  }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1) {
    this->Makefile->RemoveDefinition(variable);
    return true;
  }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
  // in the parent scope.
  if (args.size() == 2 && args[args.size() - 1] == "PARENT_SCOPE") {
    this->Makefile->RaiseScope(variable, CM_NULLPTR);
    return true;
  }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmStateEnums::CacheEntryType type =
    cmStateEnums::STRING;             // required if cache
  const char* docstring = CM_NULLPTR; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args[args.size() - 1] == "PARENT_SCOPE") {
    parentScope = true;
    ignoreLastArgs++;
  } else {
    // look for FORCE argument
    if (args.size() > 4 && args[args.size() - 1] == "FORCE") {
      force = true;
      ignoreLastArgs++;
    }

    // check for cache signature
    if (args.size() > 3 &&
        args[args.size() - 3 - (force ? 1 : 0)] == "CACHE") {
      cache = true;
      ignoreLastArgs += 3;
    }
  }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope) {
    this->Makefile->RaiseScope(variable, value.c_str());
    return true;
  }

  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args[args.size() - 1] == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache)) {
    this->SetError("given invalid arguments for CACHE mode.");
    return false;
  }

  if (cache) {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    type = cmState::StringToCacheEntryType(args[cacheStart + 1].c_str());
    docstring = args[cacheStart + 2].c_str();
  }

  // see if this is already in the cache
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(variable);
  if (existingValue &&
      (state->GetCacheEntryType(variable) != cmStateEnums::UNINITIALIZED)) {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if (cache && type != cmStateEnums::INTERNAL && !force) {
      return true;
    }
  }

  // if it is meant to be in the cache then define it in the cache
  if (cache) {
    this->Makefile->AddCacheDefinition(variable, value.c_str(), docstring,
                                       type, force);
  } else {
    // add the definition
    this->Makefile->AddDefinition(variable, value.c_str());
  }
  return true;
}